

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O0

void __thiscall ResourcePack::load_mesh(ResourcePack *this,string *name)

{
  pointer *this_00;
  vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> *this_01;
  ostream *poVar1;
  char *filename;
  ulong uVar2;
  size_type sVar3;
  mapped_type *this_02;
  undefined1 local_328 [8];
  Mesh mesh;
  undefined1 local_2c0 [7];
  bool ret;
  string terr;
  string warn;
  vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  attrib_t attrib;
  string mesh_file_path;
  ostringstream local_190 [8];
  ostringstream mesh_file_path_stream;
  string *name_local;
  ResourcePack *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"../res/");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,".obj");
  std::__cxx11::ostringstream::str();
  tinyobj::attrib_t::attrib_t
            ((attrib_t *)
             &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  this_00 = &materials.
             super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::vector
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)this_00);
  this_01 = (vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> *)
            ((long)&warn.field_2 + 8);
  std::vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>::vector(this_01);
  std::__cxx11::string::string((string *)(terr.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_2c0);
  filename = (char *)std::__cxx11::string::c_str();
  mesh.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ =
       tinyobj::LoadObj((attrib_t *)
                        &shapes.
                         super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)this_00,
                        this_01,(string *)(terr.field_2._M_local_buf + 8),(string *)local_2c0,
                        filename,(char *)0x0,true,true);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)(terr.field_2._M_local_buf + 8));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)local_2c0);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if ((mesh.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage._7_1_ & 1) == 0) {
    exit(1);
  }
  sVar3 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)
                     &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar3);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Mesh::Mesh((Mesh *)local_328,
             (vector<float,_std::allocator<float>_> *)
             &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)
             &attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)
             &attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<float,_std::allocator<float>_> *)
             &attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>_>_>
            ::operator[](&this->meshes,name);
  Mesh::operator=(this_02,(Mesh *)local_328);
  poVar1 = std::operator<<((ostream *)&std::cout,"mesh loaded");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Mesh::~Mesh((Mesh *)local_328);
  std::__cxx11::string::~string((string *)local_2c0);
  std::__cxx11::string::~string((string *)(terr.field_2._M_local_buf + 8));
  std::vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>::~vector
            ((vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> *)
             ((long)&warn.field_2 + 8));
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector
            ((vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *)
             &materials.
              super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyobj::attrib_t::~attrib_t
            ((attrib_t *)
             &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void ResourcePack::load_mesh(std::string& name) {
    std::ostringstream mesh_file_path_stream;
    mesh_file_path_stream << "../res/" << name << ".obj";
    std::string mesh_file_path = mesh_file_path_stream.str();
 
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string terr;

    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &terr, mesh_file_path.c_str());

    if (!warn.empty()) {
        std::cout << warn << std::endl;
    }

    if (!terr.empty()) {
        std::cerr << terr << std::endl;
    }

    if (!ret) {
        exit(1);
    }

    std::cout << attrib.vertices.size() << std::endl;
    Mesh mesh(attrib.vertices, attrib.normals, attrib.texcoords, attrib.colors);
    meshes[name] = mesh;

    std::cout << "mesh loaded" << std::endl;
}